

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O2

double inform_shannon_re(inform_dist *p,inform_dist *q,double base)

{
  _Bool _Var1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_38;
  
  _Var1 = inform_dist_is_valid(p);
  local_38 = NAN;
  if (((_Var1) && (_Var1 = inform_dist_is_valid(q), _Var1)) && (uVar2 = p->size, uVar2 == q->size))
  {
    local_38 = 0.0;
    for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
      if (p->histogram[uVar3] != 0) {
        if (q->histogram[uVar3] == 0) {
          return NAN;
        }
        auVar7._4_4_ = 0;
        auVar7._0_4_ = p->histogram[uVar3];
        auVar7._8_4_ = q->histogram[uVar3];
        auVar7._12_4_ = 0;
        auVar6._8_8_ = SUB168(auVar7 | _DAT_00145440,8) - DAT_00145440._8_8_;
        auVar6._0_8_ = SUB168(auVar7 | _DAT_00145440,0) - (double)DAT_00145440;
        auVar5._0_8_ = ((double)(p->counts >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                       (double)(p->counts & 0xffffffff | 0x4330000000000000);
        auVar5._8_8_ = ((double)(q->counts >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                       (double)(q->counts & 0xffffffff | 0x4330000000000000);
        auVar7 = divpd(auVar6,auVar5);
        dVar4 = log2(auVar7._0_8_ / auVar7._8_8_);
        local_38 = local_38 + dVar4 * auVar7._0_8_;
        uVar2 = p->size;
      }
    }
    dVar4 = log2(base);
    local_38 = local_38 / dVar4;
  }
  return local_38;
}

Assistant:

double inform_shannon_re(inform_dist const *p, inform_dist const *q,
    double base)
{
    if (inform_dist_is_valid(p) && inform_dist_is_valid(q) && p->size == q->size)
    {
        double re = 0.;
        for (size_t i = 0; i < p->size; ++i)
        {
            if (p->histogram[i] != 0 && q->histogram[i] != 0)
            {
                double u = (double) p->histogram[i] / p->counts;
                double v = (double) q->histogram[i] / q->counts;
                re += u * log2(u / v);
            }
            else if (p->histogram[i] != 0 && q->histogram[i] == 0)
            {
                return NAN;
            }
        }
        return re / log2(base);
    }
    return NAN;
}